

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

fy_atom * fy_fill_atom(fy_parser *fyp,int advance,fy_atom *handle)

{
  fy_atom *handle_local;
  int advance_local;
  fy_parser *fyp_local;
  
  fy_fill_atom_start(fyp,handle);
  if (0 < advance) {
    fy_advance_by(fyp,advance);
  }
  fy_fill_atom_end(fyp,handle);
  return handle;
}

Assistant:

struct fy_atom *fy_fill_atom(struct fy_parser *fyp, int advance, struct fy_atom *handle) {
    /* start mark */
    fy_fill_atom_start(fyp, handle);

    /* advance the given number of characters */
    if (advance > 0)
        fy_advance_by(fyp, advance);

    fy_fill_atom_end(fyp, handle);

    return handle;
}